

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_http_proxy_create_CONNECT
                   (httpreq **preq,Curl_cfilter *cf,Curl_easy *data,int http_version_major)

{
  CURLcode CVar1;
  size_t a_len;
  char *pcVar2;
  char *pcVar3;
  httpreq *req;
  _Bool ipv6_ip;
  int port;
  char *hostname;
  httpreq *local_58;
  _Bool local_49;
  httpreq **local_48;
  int local_3c;
  char *local_38;
  
  local_38 = (char *)0x0;
  local_58 = (httpreq *)0x0;
  local_48 = preq;
  Curl_http_proxy_get_destination(cf,&local_38,&local_3c,&local_49);
  pcVar3 = "[";
  if (local_49 == false) {
    pcVar3 = "";
  }
  pcVar3 = curl_maprintf("%s%s%s:%d",pcVar3,local_38);
  if (pcVar3 == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
    pcVar3 = (char *)0x0;
  }
  else {
    a_len = strlen(pcVar3);
    CVar1 = Curl_http_req_make(&local_58,"CONNECT",7,(char *)0x0,0,pcVar3,a_len,(char *)0x0,0);
    if (((((CVar1 == CURLE_OK) &&
          (CVar1 = Curl_http_output_auth
                             (data,cf->conn,local_58->method,HTTPREQ_GET,local_58->authority,true),
          CVar1 == CURLE_OK)) &&
         ((http_version_major != 1 ||
          ((pcVar2 = Curl_checkProxyheaders(data,cf->conn,"Host",4), pcVar2 != (char *)0x0 ||
           (CVar1 = Curl_dynhds_cadd(&local_58->headers,"Host",pcVar3), CVar1 == CURLE_OK)))))) &&
        (((pcVar2 = (data->state).aptr.proxyuserpwd, pcVar2 == (char *)0x0 ||
          (CVar1 = Curl_dynhds_h1_cadd_line(&local_58->headers,pcVar2), CVar1 == CURLE_OK)) &&
         ((((pcVar2 = Curl_checkProxyheaders(data,cf->conn,"User-Agent",10), pcVar2 != (char *)0x0
            || (pcVar2 = (data->set).str[0x2b], pcVar2 == (char *)0x0)) || (*pcVar2 == '\0')) ||
          (CVar1 = Curl_dynhds_cadd(&local_58->headers,"User-Agent",pcVar2), CVar1 == CURLE_OK))))))
       && (((http_version_major != 1 ||
            (pcVar2 = Curl_checkProxyheaders(data,cf->conn,"Proxy-Connection",0x10),
            pcVar2 != (char *)0x0)) ||
           (CVar1 = Curl_dynhds_cadd(&local_58->headers,"Proxy-Connection","Keep-Alive"),
           CVar1 == CURLE_OK)))) {
      CVar1 = Curl_dynhds_add_custom(data,true,&local_58->headers);
    }
  }
  if (local_58 != (httpreq *)0x0 && CVar1 != CURLE_OK) {
    Curl_http_req_free(local_58);
    local_58 = (httpreq *)0x0;
  }
  (*Curl_cfree)(pcVar3);
  *local_48 = local_58;
  return CVar1;
}

Assistant:

CURLcode Curl_http_proxy_create_CONNECT(struct httpreq **preq,
                                        struct Curl_cfilter *cf,
                                        struct Curl_easy *data,
                                        int http_version_major)
{
  const char *hostname = NULL;
  char *authority = NULL;
  int port;
  bool ipv6_ip;
  CURLcode result;
  struct httpreq *req = NULL;

  result = Curl_http_proxy_get_destination(cf, &hostname, &port, &ipv6_ip);
  if(result)
    goto out;

  authority = aprintf("%s%s%s:%d", ipv6_ip ? "[" : "", hostname,
                      ipv6_ip ?"]" : "", port);
  if(!authority) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = Curl_http_req_make(&req, "CONNECT", sizeof("CONNECT")-1,
                              NULL, 0, authority, strlen(authority),
                              NULL, 0);
  if(result)
    goto out;

  /* Setup the proxy-authorization header, if any */
  result = Curl_http_output_auth(data, cf->conn, req->method, HTTPREQ_GET,
                                 req->authority, TRUE);
  if(result)
    goto out;

  /* If user is not overriding Host: header, we add for HTTP/1.x */
  if(http_version_major == 1 &&
     !Curl_checkProxyheaders(data, cf->conn, STRCONST("Host"))) {
    result = Curl_dynhds_cadd(&req->headers, "Host", authority);
    if(result)
      goto out;
  }

  if(data->state.aptr.proxyuserpwd) {
    result = Curl_dynhds_h1_cadd_line(&req->headers,
                                      data->state.aptr.proxyuserpwd);
    if(result)
      goto out;
  }

  if(!Curl_checkProxyheaders(data, cf->conn, STRCONST("User-Agent")) &&
     data->set.str[STRING_USERAGENT] && *data->set.str[STRING_USERAGENT]) {
    result = Curl_dynhds_cadd(&req->headers, "User-Agent",
                              data->set.str[STRING_USERAGENT]);
    if(result)
      goto out;
  }

  if(http_version_major == 1 &&
    !Curl_checkProxyheaders(data, cf->conn, STRCONST("Proxy-Connection"))) {
    result = Curl_dynhds_cadd(&req->headers, "Proxy-Connection", "Keep-Alive");
    if(result)
      goto out;
  }

  result = Curl_dynhds_add_custom(data, TRUE, &req->headers);

out:
  if(result && req) {
    Curl_http_req_free(req);
    req = NULL;
  }
  free(authority);
  *preq = req;
  return result;
}